

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QList<QBenchmarkResult>>::emplace<QList<QBenchmarkResult>const&>
          (QMovableArrayOps<QList<QBenchmarkResult>> *this,qsizetype i,QList<QBenchmarkResult> *args
          )

{
  long *plVar1;
  int *piVar2;
  long lVar3;
  Data *pDVar4;
  long lVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<QBenchmarkResult> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = *(int **)this;
  if ((piVar2 != (int *)0x0) && (*piVar2 < 2)) {
    lVar5 = *(long *)(this + 0x10);
    if ((lVar5 == i) &&
       (lVar3 = *(long *)(this + 8),
       *(long *)(piVar2 + 2) - i !=
       ((long)(lVar3 - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 3) * -0x5555555555555555)) {
      pDVar4 = (args->d).d;
      *(Data **)(lVar3 + i * 0x18) = pDVar4;
      *(QBenchmarkResult **)(lVar3 + 8 + i * 0x18) = (args->d).ptr;
      *(qsizetype *)(lVar3 + 0x10 + i * 0x18) = (args->d).size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        i = *(qsizetype *)(this + 0x10);
      }
      *(qsizetype *)(this + 0x10) = i + 1;
      goto LAB_00136748;
    }
    if ((i == 0) &&
       (uVar6 = *(ulong *)(this + 8), ((long)piVar2 + 0x1fU & 0xfffffffffffffff0) != uVar6)) {
      pDVar4 = (args->d).d;
      *(Data **)(uVar6 - 0x18) = pDVar4;
      *(QBenchmarkResult **)(uVar6 - 0x10) = (args->d).ptr;
      *(qsizetype *)(uVar6 - 8) = (args->d).size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        uVar6 = *(ulong *)(this + 8);
        lVar5 = *(long *)(this + 0x10);
      }
      *(ulong *)(this + 8) = uVar6 - 0x18;
      *(long *)(this + 0x10) = lVar5 + 1;
      goto LAB_00136748;
    }
  }
  local_40.d = (args->d).d;
  local_40.ptr = (args->d).ptr;
  local_40.size = (args->d).size;
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  lVar5 = *(long *)(this + 0x10);
  QArrayDataPointer<QList<QBenchmarkResult>_>::detachAndGrow
            ((QArrayDataPointer<QList<QBenchmarkResult>_> *)this,(uint)(i == 0 && lVar5 != 0),1,
             (QList<QBenchmarkResult> **)0x0,(QArrayDataPointer<QList<QBenchmarkResult>_> *)0x0);
  lVar3 = *(long *)(this + 8);
  if (i == 0 && lVar5 != 0) {
    *(Data **)(lVar3 + -0x18) = local_40.d;
    *(QBenchmarkResult **)(lVar3 + -0x10) = local_40.ptr;
    *(qsizetype *)(lVar3 + -8) = local_40.size;
    *(long *)(this + 8) = lVar3 + -0x18;
  }
  else {
    plVar1 = (long *)(lVar3 + i * 0x18);
    memmove(plVar1 + 3,(void *)(lVar3 + i * 0x18),(*(long *)(this + 0x10) - i) * 0x18);
    *plVar1 = (long)local_40.d;
    plVar1[1] = (long)local_40.ptr;
    plVar1[2] = local_40.size;
  }
  local_40.size = 0;
  local_40.ptr = (QBenchmarkResult *)0x0;
  local_40.d = (Data *)0x0;
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  QArrayDataPointer<QBenchmarkResult>::~QArrayDataPointer(&local_40);
LAB_00136748:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }